

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

int __thiscall
CVmObjVector::getp_to_list(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  CVmObjPageEntry *pCVar2;
  char *pcVar3;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  size_t idx;
  vm_val_t val;
  vm_val_t local_40;
  
  if (argc == (uint *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = *argc;
  }
  if (getp_to_list(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_to_list();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_to_list::desc);
  if (iVar6 == 0) {
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    iVar6 = 1;
    if (uVar11 != 0) {
      iVar6 = CVmBif::pop_int_val();
    }
    uVar8 = (iVar6 >> 0x1f & uVar1 + 1) + iVar6;
    uVar10 = 1;
    if (1 < (int)uVar8) {
      uVar10 = uVar8;
    }
    uVar8 = (uint)uVar1;
    if (1 < uVar11) {
      uVar8 = CVmBif::pop_int_val();
    }
    pvVar5 = sp_;
    uVar12 = (uint)uVar1 - (uVar10 - 1);
    if ((int)uVar8 <= (int)uVar12) {
      uVar12 = uVar8;
    }
    if (uVar1 < uVar10) {
      uVar12 = 0;
    }
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_OBJ;
    (pvVar5->val).obj = self;
    vVar7 = CVmObjList::create(0,(long)(int)uVar12);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    if (0 < (int)uVar12) {
      pCVar2 = G_obj_table_X.pages_[vVar7 >> 0xc];
      lVar9 = (ulong)(uVar10 - 1) * 5 + 4;
      idx = 0;
      do {
        pcVar3 = (this->super_CVmObjCollection).super_CVmObject.ext_;
        local_40.typ = (vm_datatype_t)pcVar3[lVar9];
        vmb_get_dh_val(pcVar3 + lVar9,&local_40);
        CVmObjList::cons_set_element
                  ((CVmObjList *)((long)&pCVar2->ptr_ + (ulong)((vVar7 & 0xfff) * 0x18)),idx,
                   &local_40);
        idx = idx + 1;
        lVar9 = lVar9 + 5;
      } while (uVar12 != idx);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_to_list(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc)
{
    int src_cnt;
    int dst_cnt;
    int start_idx;
    CVmObjList *lst;
    int idx;
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(0, 2);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* note our size */
    src_cnt = get_element_count();

    /* 
     *   if there's a starting index, retrieve it; otherwise, start at our
     *   first element 
     */
    if (orig_argc >= 1)
        start_idx = (size_t)CVmBif::pop_int_val(vmg0_);
    else
        start_idx = 1;

    /* negative index values count from the end of the list */
    if (start_idx < 0)
        start_idx += src_cnt + 1;

    /* if the starting index is below 1, force it to 1 */
    if (start_idx < 1)
        start_idx = 1;

    /* adjust the starting index to a 0-based index */
    --start_idx;

    /* 
     *   if there's a size argument, retrieve it; if it's not specified,
     *   use our actual size for the output size 
     */
    if (orig_argc >= 2)
        dst_cnt = (size_t)CVmBif::pop_int_val(vmg0_);
    else
        dst_cnt = src_cnt;

    /* 
     *   in no case will the result list have more elements than we can
     *   actually supply 
     */
    if (start_idx >= src_cnt)
    {
        /* we're starting past our last element - we can't supply anything */
        dst_cnt = 0;
    }
    else if (src_cnt - start_idx < dst_cnt)
    {
        /* we can't supply as many values as requested - lower the size */
        dst_cnt = src_cnt - start_idx;
    }

    /* push a self-reference for garbage collection protection */
    G_stk->push()->set_obj(self);

    /* create the new list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, dst_cnt));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* set the list elements */
    for (idx = 0 ; idx < dst_cnt ; ++idx)
    {
        vm_val_t val;

        /* get my element at this index */
        get_element(idx + start_idx, &val);

        /* store the element in the list */
        lst->cons_set_element(idx, &val);
    }

    /* discard the self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}